

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

int __thiscall
UnifiedRegex::MatchTrieInst::Print(MatchTrieInst *this,DebugWriter *w,Label label,Char *litbuf)

{
  undefined4 in_register_00000014;
  char16 *litbuf_00;
  Inst *inst;
  DebugWriter *this_00;
  
  DebugWriter::Print(w,L"L%04x: ",CONCAT44(in_register_00000014,label));
  if (DAT_0145949d == '\x01') {
    DebugWriter::Print(w,L"(0x%03x bytes) ",0x11);
  }
  DebugWriter::Print(w,L"MatchTrie");
  DebugWriter::Print(w,L"(");
  TrieMixin::Print(&this->super_TrieMixin,w,litbuf_00);
  DebugWriter::PrintEOL(w,L")");
  if (DAT_0145949d == '\x01') {
    this_00 = w;
    DebugWriter::Indent(w);
    Inst::PrintBytes<UnifiedRegex::Inst>((Inst *)this_00,w,inst,&this->super_Inst,L"Inst");
    Inst::PrintBytes<UnifiedRegex::TrieMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_TrieMixin,L"TrieMixin");
    DebugWriter::Unindent(w);
  }
  return 0x11;
}

Assistant:

int MatchTrieInst::Print(DebugWriter* w, Label label, const Char* litbuf) const
    {
        PRINT_RE_BYTECODE_BEGIN("MatchTrie");
        PRINT_MIXIN(TrieMixin);
        PRINT_RE_BYTECODE_MID();
        PRINT_BYTES(TrieMixin);
        PRINT_RE_BYTECODE_END();
    }